

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# schema_features.c
# Opt level: O3

LY_ERR lys_compile_iffeature(ly_ctx *ctx,lysp_qname *qname,lysc_iffeature *iff)

{
  char cVar1;
  char cVar2;
  byte bVar3;
  ushort uVar4;
  ushort *puVar5;
  lysp_feature **pplVar6;
  bool bVar7;
  bool bVar8;
  lysc_iffeature *plVar9;
  ushort **ppuVar10;
  long *plVar11;
  uint8_t *puVar12;
  lysp_feature *plVar13;
  char *pcVar14;
  char *pcVar15;
  long lVar16;
  size_t pos;
  size_t sVar17;
  char *pcVar18;
  LY_ERR LVar19;
  long lVar20;
  uint8_t value;
  long lVar21;
  char cVar22;
  ulong uVar23;
  long local_70;
  iff_stack local_68;
  ulong local_50;
  lysp_qname *local_48;
  long local_40;
  lysc_iffeature *local_38;
  
  pcVar15 = qname->str;
  local_68.size = 0;
  local_68.index = 0;
  local_48 = qname;
  if (pcVar15 == (char *)0x0) {
    __assert_fail("c",
                  "/workspace/llm4binary/github/license_c_cmakelists/CESNET[P]libyang/src/schema_features.c"
                  ,0x146,
                  "LY_ERR lys_compile_iffeature(const struct ly_ctx *, const struct lysp_qname *, struct lysc_iffeature *)"
                 );
  }
  local_40 = 1;
  lVar20 = 0;
  lVar16 = 0;
  bVar8 = false;
  bVar7 = false;
  local_70 = 0;
  local_50 = 0;
  local_38 = iff;
  do {
    plVar9 = local_38;
    cVar1 = pcVar15[lVar20];
    uVar23 = (ulong)cVar1;
    if (uVar23 == 0x28) {
      lVar16 = lVar16 + 1;
      bVar7 = true;
    }
    else if (cVar1 == ')') {
      lVar16 = lVar16 + -1;
    }
    else {
      if (cVar1 == '\0') break;
      ppuVar10 = __ctype_b_loc();
      puVar5 = *ppuVar10;
      uVar4 = puVar5[uVar23];
      if ((uVar4 >> 0xd & 1) == 0) {
        pcVar18 = pcVar15 + lVar20;
        if (cVar1 == 'n') {
          if ((pcVar18[1] != 'o') || (lVar21 = 3, pcVar18[2] != 't')) goto LAB_0015376f;
LAB_001537c7:
          lVar20 = lVar20 + lVar21;
          cVar2 = pcVar15[lVar20];
          if ((long)cVar2 == 0) {
LAB_0015385c:
            pcVar15 = "Invalid value \"%s\" of if-feature - unexpected end of expression.";
            goto LAB_001538e9;
          }
          pcVar14 = pcVar15 + lVar20 + 1;
          cVar22 = cVar2;
          while ((*(byte *)((long)puVar5 + (long)cVar22 * 2 + 1) & 0x20) != 0) {
            cVar22 = *pcVar14;
            pcVar14 = pcVar14 + 1;
            if (cVar22 == '\0') goto LAB_0015385c;
          }
          uVar4 = puVar5[cVar2];
          if ((uVar4 >> 0xd & 1) == 0) {
            local_70 = local_70 + 1;
LAB_0015384c:
            bVar8 = false;
          }
          else {
            if (cVar1 != 'n') {
              if (local_40 != local_70) {
                ly_vlog(ctx,(char *)0x0,LYVE_SYNTAX_YANG,
                        "Invalid value \"%s\" of if-feature - missing feature/expression before \"%.*s\" operation."
                        ,pcVar15,lVar21,pcVar18);
                return LY_EVALID;
              }
              local_40 = local_70 + 1;
              goto LAB_0015384c;
            }
            bVar8 = !bVar8;
            if (!bVar8) {
              local_50 = local_50 - 2;
            }
          }
          uVar23 = (ulong)(uint)(int)cVar2;
        }
        else {
          if (cVar1 == 'o') {
            lVar21 = 2;
            if (pcVar18[1] != 'r') goto LAB_0015376f;
            goto LAB_001537c7;
          }
          if (((cVar1 == 'a') && (pcVar18[1] == 'n')) && (lVar21 = 3, pcVar18[2] == 'd'))
          goto LAB_001537c7;
LAB_0015376f:
          local_70 = local_70 + 1;
          bVar8 = false;
        }
        local_50 = local_50 + 1;
        if ((uVar4 >> 0xd & 1) == 0) {
          do {
            if (((byte)uVar23 < 0x2a) && ((0x30000000001U >> (uVar23 & 0x3f) & 1) != 0)) {
              lVar20 = lVar20 + -1;
              break;
            }
            uVar23 = (ulong)pcVar15[lVar20 + 1];
            lVar20 = lVar20 + 1;
          } while ((*(byte *)((long)puVar5 + uVar23 * 2 + 1) & 0x20) == 0);
        }
      }
      else {
        bVar7 = true;
      }
    }
    lVar20 = lVar20 + 1;
  } while( true );
  if (lVar16 != 0) {
    pcVar15 = "Invalid value \"%s\" of if-feature - non-matching opening and closing parentheses.";
LAB_001538e9:
    ly_vlog(ctx,(char *)0x0,LYVE_SYNTAX_YANG,pcVar15);
    return LY_EVALID;
  }
  if (local_40 != local_70) {
    pcVar15 = 
    "Invalid value \"%s\" of if-feature - number of features in expression does not match the required number of operands for the operations."
    ;
    goto LAB_001538e9;
  }
  if (((bVar7) || (1 < local_50)) && (local_48->mod->version != '\x02')) {
    pcVar15 = "Invalid value \"%s\" of if-feature - YANG 1.1 expression in YANG 1.0 module.";
    goto LAB_001538e9;
  }
  pplVar6 = local_38->features;
  if (pplVar6 == (lysp_feature **)0x0) {
    plVar11 = (long *)calloc(1,local_70 * 8 + 8);
    if (plVar11 == (long *)0x0) goto LAB_001539c5;
    lVar16 = 0;
  }
  else {
    plVar11 = (long *)realloc(pplVar6 + -1,((long)&pplVar6[-1]->name + local_70) * 8 + 8);
    if (plVar11 == (long *)0x0) {
LAB_001539c5:
      ly_log(ctx,LY_LLERR,LY_EMEM,"Memory allocation failed (%s()).","lys_compile_iffeature");
      return LY_EMEM;
    }
    lVar16 = *plVar11;
  }
  plVar9->features = (lysp_feature **)(plVar11 + 1);
  memset(plVar11 + lVar16 + 1,0,local_70 * 8);
  uVar23 = local_50;
  puVar12 = (uint8_t *)calloc(((local_50 >> 2) + 1) - (ulong)((local_50 & 3) == 0),1);
  plVar9->expr = puVar12;
  local_68.stack = (uint8_t *)malloc(uVar23);
  if (puVar12 == (uint8_t *)0x0 || local_68.stack == (uint8_t *)0x0) {
    LVar19 = LY_EMEM;
    ly_log(ctx,LY_LLERR,LY_EMEM,"Memory allocation failed (%s()).","lys_compile_iffeature");
  }
  else {
    local_68.size = uVar23;
    local_70 = local_70 + -1;
    pos = uVar23 - 1;
    if (0 < lVar20) {
      do {
        puVar12 = local_68.stack;
        lVar16 = lVar20 + -1;
        cVar1 = pcVar15[lVar20 + -1];
        if (cVar1 == ')') {
          value = '\b';
          goto LAB_00153a7b;
        }
        sVar17 = local_68.index;
        if (cVar1 == '(') {
          while( true ) {
            if (sVar17 == 0) {
              __assert_fail("stack && stack->index",
                            "/workspace/llm4binary/github/license_c_cmakelists/CESNET[P]libyang/src/schema_features.c"
                            ,0x111,"uint8_t iff_stack_pop(struct iff_stack *)");
            }
            sVar17 = sVar17 - 1;
            if (puVar12[sVar17] == '\b') break;
            iff_setop(plVar9->expr,puVar12[sVar17],pos);
            pos = pos - 1;
          }
        }
        else {
          ppuVar10 = __ctype_b_loc();
          puVar12 = local_68.stack;
          puVar5 = *ppuVar10;
          sVar17 = local_68.index;
          if ((*(byte *)((long)puVar5 + (long)cVar1 * 2 + 1) & 0x20) == 0) {
            do {
              if (((long)pcVar15[lVar16] == 0x28) || ((puVar5[pcVar15[lVar16]] & 0x2000) != 0))
              goto LAB_00153add;
              bVar7 = 0 < lVar16;
              lVar16 = lVar16 + -1;
            } while (bVar7);
            lVar16 = -1;
LAB_00153add:
            lVar21 = lVar16 + 1;
            pcVar18 = pcVar15 + lVar16 + 1;
            cVar1 = *pcVar18;
            if (cVar1 == 'a') {
              if (((pcVar15[lVar16 + 2] != 'n') || (pcVar15[lVar16 + 3] != 'd')) ||
                 ((*(byte *)((long)puVar5 + (long)pcVar15[lVar16 + 4] * 2 + 1) & 0x20) == 0))
              goto LAB_00153bc8;
              for (; sVar17 != 0; sVar17 = sVar17 - 1) {
                bVar3 = puVar12[sVar17 - 1];
                if (1 < bVar3) goto LAB_00153c74;
                iff_setop(plVar9->expr,bVar3,pos);
                pos = pos - 1;
              }
              sVar17 = 0;
LAB_00153c74:
              value = '\x01';
              lVar16 = lVar21;
              local_68.index = sVar17;
            }
            else if (cVar1 == 'o') {
              if ((pcVar15[lVar16 + 2] != 'r') ||
                 ((*(byte *)((long)puVar5 + (long)pcVar15[lVar16 + 3] * 2 + 1) & 0x20) == 0))
              goto LAB_00153bc8;
              for (; sVar17 != 0; sVar17 = sVar17 - 1) {
                bVar3 = puVar12[sVar17 - 1];
                if (2 < bVar3) goto LAB_00153b98;
                iff_setop(plVar9->expr,bVar3,pos);
                pos = pos - 1;
              }
              sVar17 = 0;
LAB_00153b98:
              value = '\x02';
              lVar16 = lVar21;
              local_68.index = sVar17;
            }
            else {
              if ((((cVar1 != 'n') || (pcVar15[lVar16 + 2] != 'o')) || (pcVar15[lVar16 + 3] != 't'))
                 || ((*(byte *)((long)puVar5 + (long)pcVar15[lVar16 + 4] * 2 + 1) & 0x20) == 0)) {
LAB_00153bc8:
                plVar9->expr[pos >> 2] =
                     plVar9->expr[pos >> 2] | '\x03' << ((char)pos * '\x02' & 6U);
                plVar13 = lysp_feature_find(local_48->mod,pcVar18,lVar20 - lVar21,'\x01');
                if (plVar13 != (lysp_feature *)0x0) {
                  pos = pos - 1;
                  plVar9->features[local_70] = plVar13;
                  plVar9->features[-1] = (lysp_feature *)((long)&plVar9->features[-1]->name + 1);
                  local_70 = local_70 + -1;
                  lVar16 = lVar21;
                  sVar17 = local_68.index;
                  goto LAB_00153c2e;
                }
                ly_vlog(ctx,(char *)0x0,LYVE_SYNTAX_YANG,
                        "Invalid value \"%s\" of if-feature - unable to find feature \"%.*s\".",
                        local_48->str,lVar20 - lVar21 & 0xffffffff,pcVar18);
                LVar19 = LY_EVALID;
                goto LAB_00153d06;
              }
              if ((local_68.index != 0) && (local_68.stack[local_68.index - 1] == '\0')) {
                lVar16 = lVar21;
                sVar17 = local_68.index - 1;
                goto LAB_00153c2e;
              }
              value = '\0';
              lVar16 = lVar21;
            }
LAB_00153a7b:
            iff_stack_push(&local_68,value);
            sVar17 = local_68.index;
          }
        }
LAB_00153c2e:
        local_68.index = sVar17;
        lVar20 = lVar16;
        puVar12 = local_68.stack;
        sVar17 = local_68.index;
      } while (0 < lVar20);
      for (; sVar17 != 0; sVar17 = sVar17 - 1) {
        iff_setop(plVar9->expr,puVar12[sVar17 - 1],pos);
        pos = pos - 1;
      }
    }
    local_68.index = 0;
    if ((pos == 0xffffffffffffffff) && (LVar19 = LY_SUCCESS, local_70 == -1)) goto LAB_00153d2b;
    ly_vlog(ctx,(char *)0x0,LYVE_SYNTAX_YANG,
            "Invalid value \"%s\" of if-feature - processing error.",local_48->str);
    LVar19 = LY_EINT;
  }
LAB_00153d06:
  if (plVar9->features != (lysp_feature **)0x0) {
    free(plVar9->features + -1);
  }
  plVar9->features = (lysp_feature **)0x0;
  free(plVar9->expr);
  plVar9->expr = (uint8_t *)0x0;
LAB_00153d2b:
  free(local_68.stack);
  return LVar19;
}

Assistant:

static LY_ERR
lys_compile_iffeature(const struct ly_ctx *ctx, const struct lysp_qname *qname, struct lysc_iffeature *iff)
{
    LY_ERR rc = LY_SUCCESS;
    const char *c = qname->str;
    int64_t i, j;
    int8_t op_len, last_not = 0, checkversion = 0;
    LY_ARRAY_COUNT_TYPE f_size = 0, expr_size = 0, f_exp = 1;
    uint8_t op;
    struct iff_stack stack = {0, 0, NULL};
    struct lysp_feature *f;

    assert(c);

    /* pre-parse the expression to get sizes for arrays, also do some syntax checks of the expression */
    for (i = j = 0; c[i]; i++) {
        if (c[i] == '(') {
            j++;
            checkversion = 1;
            continue;
        } else if (c[i] == ')') {
            j--;
            continue;
        } else if (isspace(c[i])) {
            checkversion = 1;
            continue;
        }

        if (!strncmp(&c[i], "not", op_len = ly_strlen_const("not")) ||
                !strncmp(&c[i], "and", op_len = ly_strlen_const("and")) ||
                !strncmp(&c[i], "or", op_len = ly_strlen_const("or"))) {
            uint64_t spaces;

            for (spaces = 0; c[i + op_len + spaces] && isspace(c[i + op_len + spaces]); spaces++) {}
            if (c[i + op_len + spaces] == '\0') {
                LOGVAL(ctx, LYVE_SYNTAX_YANG, "Invalid value \"%s\" of if-feature - unexpected end of expression.", qname->str);
                return LY_EVALID;
            } else if (!isspace(c[i + op_len])) {
                /* feature name starting with the not/and/or */
                last_not = 0;
                f_size++;
            } else if (c[i] == 'n') { /* not operation */
                if (last_not) {
                    /* double not */
                    expr_size = expr_size - 2;
                    last_not = 0;
                } else {
                    last_not = 1;
                }
            } else { /* and, or */
                if (f_exp != f_size) {
                    LOGVAL(ctx, LYVE_SYNTAX_YANG,
                            "Invalid value \"%s\" of if-feature - missing feature/expression before \"%.*s\" operation.",
                            qname->str, op_len, &c[i]);
                    return LY_EVALID;
                }
                f_exp++;

                /* not a not operation */
                last_not = 0;
            }
            i += op_len;
        } else {
            f_size++;
            last_not = 0;
        }
        expr_size++;

        while (!isspace(c[i])) {
            if (!c[i] || (c[i] == ')') || (c[i] == '(')) {
                i--;
                break;
            }
            i++;
        }
    }
    if (j) {
        /* not matching count of ( and ) */
        LOGVAL(ctx, LYVE_SYNTAX_YANG, "Invalid value \"%s\" of if-feature - non-matching opening and closing parentheses.",
                qname->str);
        return LY_EVALID;
    }
    if (f_exp != f_size) {
        /* features do not match the needed arguments for the logical operations */
        LOGVAL(ctx, LYVE_SYNTAX_YANG, "Invalid value \"%s\" of if-feature - number of features in expression does not match "
                "the required number of operands for the operations.", qname->str);
        return LY_EVALID;
    }

    if (checkversion || (expr_size > 1)) {
        /* check that we have 1.1 module */
        if (qname->mod->version != LYS_VERSION_1_1) {
            LOGVAL(ctx, LYVE_SYNTAX_YANG, "Invalid value \"%s\" of if-feature - YANG 1.1 expression in YANG 1.0 module.",
                    qname->str);
            return LY_EVALID;
        }
    }

    /* allocate the memory */
    LY_ARRAY_CREATE_RET(ctx, iff->features, f_size, LY_EMEM);
    iff->expr = calloc((j = (expr_size / IFF_RECORDS_IN_BYTE) + ((expr_size % IFF_RECORDS_IN_BYTE) ? 1 : 0)), sizeof *iff->expr);
    stack.stack = malloc(expr_size * sizeof *stack.stack);
    LY_CHECK_ERR_GOTO(!stack.stack || !iff->expr, LOGMEM(ctx); rc = LY_EMEM, cleanup);

    stack.size = expr_size;
    f_size--; expr_size--; /* used as indexes from now */

    for (i--; i >= 0; i--) {
        if (c[i] == ')') {
            /* push it on stack */
            iff_stack_push(&stack, LYS_IFF_RP);
            continue;
        } else if (c[i] == '(') {
            /* pop from the stack into result all operators until ) */
            while ((op = iff_stack_pop(&stack)) != LYS_IFF_RP) {
                iff_setop(iff->expr, op, expr_size--);
            }
            continue;
        } else if (isspace(c[i])) {
            continue;
        }

        /* end of operator or operand -> find beginning and get what is it */
        j = i + 1;
        while (i >= 0 && !isspace(c[i]) && c[i] != '(') {
            i--;
        }
        i++; /* go back by one step */

        if (!strncmp(&c[i], "not", ly_strlen_const("not")) && isspace(c[i + ly_strlen_const("not")])) {
            if (stack.index && (stack.stack[stack.index - 1] == LYS_IFF_NOT)) {
                /* double not */
                iff_stack_pop(&stack);
            } else {
                /* not has the highest priority, so do not pop from the stack
                 * as in case of AND and OR */
                iff_stack_push(&stack, LYS_IFF_NOT);
            }
        } else if (!strncmp(&c[i], "and", ly_strlen_const("and")) && isspace(c[i + ly_strlen_const("and")])) {
            /* as for OR - pop from the stack all operators with the same or higher
             * priority and store them to the result, then push the AND to the stack */
            while (stack.index && stack.stack[stack.index - 1] <= LYS_IFF_AND) {
                op = iff_stack_pop(&stack);
                iff_setop(iff->expr, op, expr_size--);
            }
            iff_stack_push(&stack, LYS_IFF_AND);
        } else if (!strncmp(&c[i], "or", 2) && isspace(c[i + 2])) {
            while (stack.index && stack.stack[stack.index - 1] <= LYS_IFF_OR) {
                op = iff_stack_pop(&stack);
                iff_setop(iff->expr, op, expr_size--);
            }
            iff_stack_push(&stack, LYS_IFF_OR);
        } else {
            /* feature name, length is j - i */

            /* add it to the expression */
            iff_setop(iff->expr, LYS_IFF_F, expr_size--);

            /* now get the link to the feature definition */
            f = lysp_feature_find(qname->mod, &c[i], j - i, 1);
            if (!f) {
                LOGVAL(ctx, LYVE_SYNTAX_YANG, "Invalid value \"%s\" of if-feature - unable to find feature \"%.*s\".",
                        qname->str, (int)(j - i), &c[i]);
                rc = LY_EVALID;
                goto cleanup;
            }
            iff->features[f_size] = f;
            LY_ARRAY_INCREMENT(iff->features);
            f_size--;
        }
    }
    while (stack.index) {
        op = iff_stack_pop(&stack);
        iff_setop(iff->expr, op, expr_size--);
    }

    if (++expr_size || ++f_size) {
        /* not all expected operators and operands found */
        LOGVAL(ctx, LYVE_SYNTAX_YANG, "Invalid value \"%s\" of if-feature - processing error.", qname->str);
        rc = LY_EINT;
    }

cleanup:
    if (rc) {
        LY_ARRAY_FREE(iff->features);
        iff->features = NULL;
        free(iff->expr);
        iff->expr = NULL;
    }
    iff_stack_clean(&stack);
    return rc;
}